

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefinePropertyValueUint32(JSContext *ctx,JSValue this_obj,uint32_t idx,JSValue val,int flags)

{
  JSValueUnion JVar1;
  int iVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue prop;
  JSValue val_local;
  
  JVar1._4_4_ = 0;
  JVar1.int32 = idx;
  JVar3.float64 = (double)JVar1.float64;
  if (-1 < (int)idx) {
    JVar3 = JVar1;
  }
  iVar4 = 7;
  if (-1 < (int)idx) {
    iVar4 = 0;
  }
  prop.tag = iVar4;
  prop.u.float64 = JVar3.float64;
  iVar2 = JS_DefinePropertyValueValue(ctx,this_obj,prop,val,flags);
  return iVar2;
}

Assistant:

int JS_DefinePropertyValueUint32(JSContext *ctx, JSValueConst this_obj,
                                 uint32_t idx, JSValue val, int flags)
{
    return JS_DefinePropertyValueValue(ctx, this_obj, JS_NewUint32(ctx, idx),
                                       val, flags);
}